

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O3

int sinc_hex_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  float *pfVar1;
  SINC_FILTER *filter;
  float *pfVar2;
  coeff_t *pcVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double local_80;
  undefined8 local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  
  filter = (SINC_FILTER *)psrc->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    iVar8 = 5;
  }
  else {
    iVar17 = filter->channels;
    filter->in_count = data->input_frames * (long)iVar17;
    filter->out_count = data->output_frames * (long)iVar17;
    filter->out_gen = 0;
    filter->in_used = 0;
    local_80 = psrc->last_ratio;
    iVar8 = 0x16;
    if ((0.00390625 <= local_80) && (local_80 <= 256.0)) {
      dVar18 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
      dVar28 = local_80;
      if (data->src_ratio <= local_80) {
        dVar28 = data->src_ratio;
      }
      lVar9 = lrint((double)(-(ulong)(dVar28 < 1.0) & (ulong)(dVar18 / dVar28) |
                            ~-(ulong)(dVar28 < 1.0) & (ulong)dVar18));
      dVar18 = psrc->last_position;
      lVar10 = lrint(dVar18);
      dVar28 = dVar18 - (double)lVar10;
      dVar28 = (double)(~-(ulong)(dVar28 < 0.0) & (ulong)dVar28 |
                       (ulong)(dVar28 + 1.0) & -(ulong)(dVar28 < 0.0));
      iVar8 = filter->b_current;
      iVar12 = filter->channels;
      lVar10 = lrint(dVar18 - dVar28);
      lVar15 = (long)filter->b_len;
      lVar10 = (lVar10 * iVar12 + (long)iVar8) % lVar15;
      filter->b_current = (int)lVar10;
      local_78._0_4_ = SUB84(dVar28,0);
      local_78._4_4_ = (undefined4)((ulong)dVar28 >> 0x20);
      if (filter->out_gen < filter->out_count) {
        iVar17 = ((int)lVar9 + 1) * iVar17;
        dVar18 = 1.0 / local_80;
        do {
          iVar8 = (int)lVar10;
          if (((filter->b_end - iVar8) + (int)lVar15) % (int)lVar15 <= iVar17) {
            iVar8 = prepare_data(filter,data,iVar17);
            psrc->error = iVar8;
            if (iVar8 != 0) {
              return iVar8;
            }
            iVar8 = filter->b_current;
            if (((filter->b_end - iVar8) + filter->b_len) % filter->b_len <= iVar17) break;
          }
          if ((-1 < filter->b_real_end) &&
             ((double)filter->b_real_end <=
              (double)iVar8 + (double)CONCAT44(local_78._4_4_,(undefined4)local_78) + dVar18 + 1e-20
             )) break;
          if (0 < filter->out_count) {
            dVar28 = psrc->last_ratio;
            if (1e-10 < ABS(dVar28 - data->src_ratio)) {
              local_80 = ((data->src_ratio - dVar28) * (double)filter->out_gen) /
                         (double)filter->out_count + dVar28;
            }
          }
          dVar28 = local_80;
          if (1.0 <= local_80) {
            dVar28 = 1.0;
          }
          dVar28 = dVar28 * (double)filter->index_inc;
          lVar10 = lrint(dVar28 * 4096.0);
          lVar15 = lrint(local_78 * dVar28 * 4096.0);
          pfVar2 = data->data_out;
          lVar9 = filter->out_gen;
          iVar14 = filter->coeff_half_len * 0x1000;
          iVar12 = (int)lVar15;
          iVar16 = (int)lVar10;
          iVar8 = (iVar14 - iVar12) / iVar16;
          uVar13 = iVar8 * iVar16 + iVar12;
          pcVar3 = filter->coeffs;
          puVar11 = (undefined8 *)
                    ((long)filter[1].left_calc +
                    (long)(filter->b_current - iVar8 * filter->channels) * 4 + -0x48);
          dVar4 = 0.0;
          dVar5 = 0.0;
          dVar6 = 0.0;
          dVar7 = 0.0;
          dVar19 = 0.0;
          dVar20 = 0.0;
          do {
            dVar24 = (double)(pcVar3[(long)((int)uVar13 >> 0xc) + 1] - pcVar3[(int)uVar13 >> 0xc]) *
                     (double)(uVar13 & 0xfff) * 0.000244140625 + (double)pcVar3[(int)uVar13 >> 0xc];
            dVar6 = dVar6 + (double)(float)puVar11[-1] * dVar24;
            dVar7 = dVar7 + (double)(float)((ulong)puVar11[-1] >> 0x20) * dVar24;
            dVar4 = dVar4 + (double)(float)puVar11[-2] * dVar24;
            dVar5 = dVar5 + (double)(float)((ulong)puVar11[-2] >> 0x20) * dVar24;
            dVar19 = dVar19 + (double)(float)*puVar11 * dVar24;
            dVar20 = dVar20 + (double)(float)((ulong)*puVar11 >> 0x20) * dVar24;
            puVar11 = puVar11 + 3;
            uVar13 = uVar13 - iVar16;
          } while (-1 < (int)uVar13);
          dVar28 = dVar28 / (double)filter->index_inc;
          iVar8 = (iVar14 - (iVar16 - iVar12)) / iVar16;
          uVar13 = iVar8 * iVar16 + (iVar16 - iVar12);
          puVar11 = (undefined8 *)
                    ((long)filter[1].left_calc +
                    (long)((iVar8 + 1) * filter->channels + filter->b_current) * 4 + -0x48);
          dVar22 = 0.0;
          dVar23 = 0.0;
          dVar25 = 0.0;
          dVar26 = 0.0;
          dVar24 = 0.0;
          dVar21 = 0.0;
          do {
            dVar27 = (double)(pcVar3[(long)((int)uVar13 >> 0xc) + 1] - pcVar3[(int)uVar13 >> 0xc]) *
                     (double)(uVar13 & 0xfff) * 0.000244140625 + (double)pcVar3[(int)uVar13 >> 0xc];
            dVar25 = dVar25 + (double)(float)puVar11[-1] * dVar27;
            dVar26 = dVar26 + (double)(float)((ulong)puVar11[-1] >> 0x20) * dVar27;
            dVar22 = dVar22 + (double)(float)puVar11[-2] * dVar27;
            dVar23 = dVar23 + (double)(float)((ulong)puVar11[-2] >> 0x20) * dVar27;
            dVar24 = dVar24 + (double)(float)*puVar11 * dVar27;
            dVar21 = dVar21 + (double)(float)((ulong)*puVar11 >> 0x20) * dVar27;
            uVar13 = uVar13 - iVar16;
            puVar11 = puVar11 + -3;
          } while (0 < (int)uVar13);
          pfVar1 = pfVar2 + lVar9;
          *pfVar1 = (float)((dVar4 + dVar22) * dVar28);
          pfVar1[1] = (float)((dVar5 + dVar23) * dVar28);
          pfVar1[2] = (float)((dVar6 + dVar25) * dVar28);
          pfVar1[3] = (float)((dVar7 + dVar26) * dVar28);
          *(ulong *)(pfVar2 + lVar9 + 4) =
               CONCAT44((float)((dVar20 + dVar21) * dVar28),(float)((dVar19 + dVar24) * dVar28));
          filter->out_gen = lVar9 + 6;
          local_78 = local_78 + 1.0 / local_80;
          lVar9 = lrint(local_78);
          dVar28 = local_78 - (double)lVar9;
          dVar28 = (double)(~-(ulong)(dVar28 < 0.0) & (ulong)dVar28 |
                           (ulong)(dVar28 + 1.0) & -(ulong)(dVar28 < 0.0));
          iVar8 = filter->b_current;
          iVar12 = filter->channels;
          lVar9 = lrint(local_78 - dVar28);
          local_58 = SUB84(dVar28,0);
          uStack_54 = (undefined4)((ulong)dVar28 >> 0x20);
          lVar15 = (long)filter->b_len;
          lVar10 = (lVar9 * iVar12 + (long)iVar8) % lVar15;
          filter->b_current = (int)lVar10;
          local_78._0_4_ = local_58;
          local_78._4_4_ = uStack_54;
        } while (filter->out_gen < filter->out_count);
      }
      *(undefined4 *)&psrc->last_position = (undefined4)local_78;
      *(undefined4 *)((long)&psrc->last_position + 4) = local_78._4_4_;
      psrc->last_ratio = local_80;
      iVar8 = filter->channels;
      data->input_frames_used = filter->in_used / (long)iVar8;
      data->output_frames_gen = filter->out_gen / (long)iVar8;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

static int
sinc_hex_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) psrc->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * filter->channels ;
	filter->out_count = data->output_frames * filter->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (psrc->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (psrc->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = filter->channels * (lrint (count) + 1) ;

	input_index = psrc->last_position ;
	float_increment = filter->index_inc ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + filter->channels * lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((psrc->error = prepare_data (filter, data, half_filter_chan_len)) != 0)
				return psrc->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = psrc->last_ratio + filter->out_gen * (data->src_ratio - psrc->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_hex (filter, increment, start_filter_index, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += 6 ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + filter->channels * lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	psrc->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / filter->channels ;
	data->output_frames_gen = filter->out_gen / filter->channels ;

	return SRC_ERR_NO_ERROR ;
}